

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-1123_type.h
# Opt level: O2

bool date::rfc1123::write<std::ostreambuf_iterator<char,std::char_traits<char>>>
               (parts *dt,ostreambuf_iterator<char,_std::char_traits<char>_> *dst)

{
  bool bVar1;
  array<std::pair<date::static_string<char,_4UL>,_short>,_11UL> zone_aliases;
  array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_7UL> weekday_aliases;
  array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_12UL> month_aliases;
  
  bVar1 = validate(dt);
  if (bVar1) {
    memcpy(&weekday_aliases,&DAT_0010c248,0xa8);
    memcpy(&month_aliases,&DAT_0010c2f0,0x120);
    memcpy(&zone_aliases,&DAT_0010c410,0x108);
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char,4ul>
              (dst,&weekday_aliases._M_elems[(ulong)dt->week_day - 1].first);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,',');
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,' ');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->day);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,' ');
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char,4ul>
              (dst,&month_aliases._M_elems[(ulong)dt->month - 1].first);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,' ');
    number_writer<4>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_short>
              (dst,dt->year);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,' ');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->hour);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,':');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->minute);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,':');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->second);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,' ');
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char,4ul>
              (dst,&zone_aliases._M_elems[1].first);
  }
  return bVar1;
}

Assistant:

static bool write(const parts& dt, Iterator& dst)
    {
        if (!validate(dt))
            return false;

        using char_type = typename iterator_traits<Iterator>::value_type;
        constexpr auto weekday_aliases = weekday_names<char_type>();
        constexpr auto month_aliases = month_names<char_type>();
        constexpr auto zone_aliases = zone_names<char_type>();

        characters_writer::write(dst, weekday_aliases[dt.week_day - 1].first);
        characters_writer::write(dst, char_type{ ',' });
        characters_writer::write(dst, char_type{ ' ' });
        number_writer<2>::write(dst, dt.day);
        characters_writer::write(dst, char_type{ ' ' });
        characters_writer::write(dst, month_aliases[dt.month - 1].first);
        characters_writer::write(dst, char_type{ ' ' });
        number_writer<4>::write(dst, dt.year);
        characters_writer::write(dst, char_type{ ' ' });
        number_writer<2>::write(dst, dt.hour);
        characters_writer::write(dst, char_type{ ':' });
        number_writer<2>::write(dst, dt.minute);
        characters_writer::write(dst, char_type{ ':' });
        number_writer<2>::write(dst, dt.second);
        characters_writer::write(dst, char_type{ ' ' });
        characters_writer::write(dst, zone_aliases[1].first);

        return true;
    }